

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Low_options>::insert_simplex_and_subfaces<std::initializer_list<unsigned_char>>
          (Simplex_tree<Low_options> *this,initializer_list<unsigned_char> *Nsimplex,
          Filtration_value *filtration)

{
  char cVar1;
  int iVar2;
  Filtration_value FVar3;
  Filtration_value FVar4;
  long lVar5;
  int iVar6;
  Filtration_value *pFVar7;
  char *pcVar8;
  undefined8 *puVar9;
  char cVar10;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var11;
  Filtration_value *pFVar12;
  Filtration_value *filt;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  long *in_FS_OFFSET;
  pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
  pVar13;
  
  FVar3 = filtration[1];
  if (FVar3 == 0.0) {
    (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)0x0;
    *(undefined1 *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = 1;
  }
  else {
    FVar4 = *filtration;
    if ((char)in_FS_OFFSET[-0x1d] == '\0') {
      insert_simplex_and_subfaces<std::initializer_list<unsigned_char>>();
    }
    lVar5 = in_FS_OFFSET[-0x20];
    if (in_FS_OFFSET[-0x1f] != lVar5) {
      in_FS_OFFSET[-0x1f] = lVar5;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)(*in_FS_OFFSET + -0x100),lVar5
               ,FVar4,(long)FVar3 + (long)FVar4);
    last._M_current = (uchar *)in_FS_OFFSET[-0x20];
    filt = (Filtration_value *)in_FS_OFFSET[-0x1f];
    if ((Filtration_value *)last._M_current != filt) {
      lVar5 = 0x3f;
      if ((long)filt - (long)last._M_current != 0) {
        for (; (ulong)((long)filt - (long)last._M_current) >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (last._M_current,filt,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (last._M_current,filt);
      last._M_current = (uchar *)in_FS_OFFSET[-0x20];
      filt = (Filtration_value *)in_FS_OFFSET[-0x1f];
    }
    if ((Filtration_value *)last._M_current != filt) {
      pFVar12 = (Filtration_value *)((long)last._M_current + 1);
      do {
        pFVar7 = pFVar12;
        if (pFVar7 == filt) goto LAB_00157dfa;
        pFVar12 = (Filtration_value *)((long)pFVar7 + 1);
      } while (*(char *)((long)pFVar7 + -1) != *(char *)pFVar7);
      pcVar8 = (char *)((long)pFVar7 + -1);
      cVar10 = *(char *)((long)pFVar7 + -1);
      if (pFVar12 != filt) {
        do {
          cVar1 = *(char *)pFVar12;
          if (cVar10 != cVar1) {
            pcVar8[1] = cVar1;
            pcVar8 = pcVar8 + 1;
          }
          pFVar12 = (Filtration_value *)((long)pFVar12 + 1);
          cVar10 = cVar1;
        } while (pFVar12 != filt);
        filt = (Filtration_value *)in_FS_OFFSET[-0x1f];
        last._M_current = (uchar *)in_FS_OFFSET[-0x20];
      }
      pFVar12 = (Filtration_value *)(pcVar8 + 1);
      if (pFVar12 != filt) {
        in_FS_OFFSET[-0x1f] = (long)pFVar12;
        filt = pFVar12;
      }
    }
LAB_00157dfa:
    if ((Filtration_value *)last._M_current != filt) {
      _Var11._M_current = last._M_current;
      do {
        if (*_Var11._M_current == (char)Nsimplex[3]._M_len) {
          puVar9 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar9 = "cannot use the dummy null_vertex() as a real vertex";
          __cxa_throw(puVar9,&char_const*::typeinfo,0);
        }
        _Var11._M_current = _Var11._M_current + 1;
      } while ((Filtration_value *)_Var11._M_current != filt);
    }
    iVar6 = ~(uint)last._M_current + (int)filt;
    iVar2 = (int)Nsimplex[8]._M_len;
    if (iVar6 < iVar2) {
      iVar6 = iVar2;
    }
    *(int *)&Nsimplex[8]._M_len = iVar6;
    pVar13 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                       (this,(Siblings *)Nsimplex,
                        (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         )(Nsimplex + 4),last,filt);
    filtration = pVar13._8_8_;
  }
  pVar13._8_8_ = filtration;
  pVar13.first.m_iit.members_.nodeptr_ =
       (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
        )(tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
          )this;
  return pVar13;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_and_subfaces(
      const InputVertexRange& Nsimplex,
      const Filtration_value& filtration = Filtration_value())
  {
    auto first = std::begin(Nsimplex);
    auto last = std::end(Nsimplex);

    if (first == last)
      return { null_simplex(), true }; // FIXME: false would make more sense to me.

    thread_local std::vector<Vertex_handle> copy;
    copy.clear();
    copy.insert(copy.end(), first, last);
    std::sort(copy.begin(), copy.end());
    auto last_unique = std::unique(copy.begin(), copy.end());
    copy.erase(last_unique, copy.end());
    GUDHI_CHECK_code(
      for (Vertex_handle v : copy)
        GUDHI_CHECK(v != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    )
    // Update dimension if needed. We could wait to see if the insertion succeeds, but I doubt there is much to gain.
    dimension_ = (std::max)(dimension_, static_cast<int>(std::distance(copy.begin(), copy.end())) - 1);

    return rec_insert_simplex_and_subfaces_sorted(root(), copy.begin(), copy.end(), filtration);
  }